

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O3

void __thiscall FunctionTable::GetCurrentTermTopLabel(FunctionTable *this,string *top_label)

{
  pointer pFVar1;
  long lVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  pFVar1 = (this->m_func_table).
           super__Vector_base<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = *(long *)&pFVar1[this->m_current_term_ptr].m_top_label._M_dataplus;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,lVar2,
             pFVar1[this->m_current_term_ptr].m_top_label._M_string_length + lVar2);
  std::__cxx11::string::operator=((string *)top_label,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void FunctionTable::GetCurrentTermTopLabel(string& top_label) const {
    top_label = m_func_table[m_current_term_ptr].GetTopLabel();
}